

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

void duckdb::ArrayCrossProductFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  long in_RDI;
  long lVar2;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType double_array;
  LogicalType float_array;
  allocator_type local_489;
  LogicalType local_488 [24];
  LogicalType local_470 [24];
  code *local_458;
  undefined8 uStack_450;
  code *local_448;
  code *pcStack_440;
  code *local_438;
  undefined8 uStack_430;
  code *local_428;
  code *pcStack_420;
  LogicalType local_410 [24];
  LogicalType local_3f8 [24];
  LogicalType local_3e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c8;
  LogicalType local_3b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_398;
  LogicalType local_380 [24];
  LogicalType local_368 [24];
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"array_cross_product","");
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_350[0] != local_340) {
    operator_delete(local_350[0]);
  }
  duckdb::LogicalType::LogicalType(local_488,FLOAT);
  duckdb::LogicalType::ARRAY(local_3f8,(optional_idx)local_488);
  duckdb::LogicalType::~LogicalType(local_488);
  duckdb::LogicalType::LogicalType(local_488,DOUBLE);
  duckdb::LogicalType::ARRAY(local_410,(optional_idx)local_488);
  duckdb::LogicalType::~LogicalType(local_488);
  duckdb::LogicalType::LogicalType(local_488,local_3f8);
  duckdb::LogicalType::LogicalType(local_470,local_3f8);
  __l._M_len = 2;
  __l._M_array = local_488;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_398,__l,&local_489);
  duckdb::LogicalType::LogicalType(local_3b0,local_3f8);
  uStack_430 = 0;
  local_438 = ArrayFixedCombine<float,duckdb::CrossProductOp,3ul>;
  pcStack_420 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_428 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_368,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_398,local_3b0,&local_438,0,0,0,0,local_368,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_368);
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,3);
  }
  duckdb::LogicalType::~LogicalType(local_3b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_398);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_488 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_488,local_410);
  duckdb::LogicalType::LogicalType(local_470,local_410);
  __l_00._M_len = 2;
  __l_00._M_array = local_488;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3c8,__l_00,&local_489);
  duckdb::LogicalType::LogicalType(local_3e0,local_410);
  uStack_450 = 0;
  local_458 = ArrayFixedCombine<double,duckdb::CrossProductOp,3ul>;
  pcStack_440 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_448 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_380,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_3c8,local_3e0,&local_458,0,0,0,0,local_380,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_380);
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,3);
  }
  duckdb::LogicalType::~LogicalType(local_3e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c8);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_488 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = *(BaseScalarFunction **)(in_RDI + 0x20);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  duckdb::LogicalType::~LogicalType(local_410);
  duckdb::LogicalType::~LogicalType(local_3f8);
  return;
}

Assistant:

ScalarFunctionSet ArrayCrossProductFun::GetFunctions() {
	ScalarFunctionSet set("array_cross_product");

	auto float_array = LogicalType::ARRAY(LogicalType::FLOAT, 3);
	auto double_array = LogicalType::ARRAY(LogicalType::DOUBLE, 3);
	set.AddFunction(
	    ScalarFunction({float_array, float_array}, float_array, ArrayFixedCombine<float, CrossProductOp, 3>));
	set.AddFunction(
	    ScalarFunction({double_array, double_array}, double_array, ArrayFixedCombine<double, CrossProductOp, 3>));
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}